

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int classify_keyword(char *start,char *end,int flags)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  
  lVar3 = (long)end - (long)start;
  if (lVar3 == 5) {
    lVar2 = 0;
    do {
      bVar1 = start[lVar2];
      bVar4 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar4 = bVar1;
      }
      bVar1 = "alpha"[lVar2];
      bVar5 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar5 = bVar1;
      }
      if (bVar4 != bVar5) goto LAB_001016b9;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
  }
  else if (lVar3 == 4) {
    lVar2 = 0;
    do {
      bVar1 = start[lVar2];
      bVar4 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar4 = bVar1;
      }
      bVar1 = "beta"[lVar2];
      bVar5 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar5 = bVar1;
      }
      if (bVar4 != bVar5) goto LAB_001016b9;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
LAB_001016b9:
    if (lVar3 == 2) {
      lVar2 = 0;
      do {
        bVar1 = start[lVar2];
        bVar4 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar4 = bVar1;
        }
        bVar1 = "rc"[lVar2];
        bVar5 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar5 = bVar1;
        }
        if (bVar4 != bVar5) goto LAB_00101710;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 2);
    }
    else {
LAB_00101710:
      if (lVar3 < 3) {
LAB_0010182b:
        if (lVar3 == 2) {
          lVar2 = 0;
          while( true ) {
            bVar1 = start[lVar2];
            bVar4 = bVar1 | 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar4 = bVar1;
            }
            bVar1 = "pl"[lVar2];
            bVar5 = bVar1 | 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar5 = bVar1;
            }
            if (bVar4 != bVar5) break;
            lVar2 = lVar2 + 1;
            if (lVar2 == 2) {
              return 2;
            }
          }
        }
        if (lVar3 == 6) {
          lVar2 = 0;
          while( true ) {
            bVar1 = start[lVar2];
            bVar4 = bVar1 | 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar4 = bVar1;
            }
            bVar1 = "errata"[lVar2];
            bVar5 = bVar1 | 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar5 = bVar1;
            }
            if (bVar4 != bVar5) break;
            lVar2 = lVar2 + 1;
            if (lVar2 == 6) {
              return 2;
            }
          }
        }
        if (lVar3 == 1 && (flags & 1U) != 0) {
          return (uint)((*start + 0xb0U & 0xdf) == 0) * 2;
        }
        return 0;
      }
      lVar2 = 0;
      do {
        bVar1 = start[lVar2];
        bVar4 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar4 = bVar1;
        }
        bVar1 = "pre"[lVar2];
        bVar5 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar5 = bVar1;
        }
        if (bVar4 != bVar5) {
          if (lVar3 == 3) {
            return 0;
          }
          lVar2 = 0;
          while( true ) {
            bVar1 = start[lVar2];
            bVar4 = bVar1 | 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar4 = bVar1;
            }
            bVar1 = "post"[lVar2];
            bVar5 = bVar1 | 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar5 = bVar1;
            }
            if (bVar4 != bVar5) break;
            lVar2 = lVar2 + 1;
            if (lVar2 == 4) {
              return 2;
            }
          }
          if (4 < lVar3) {
            lVar2 = 0;
            while( true ) {
              bVar1 = start[lVar2];
              bVar4 = bVar1 | 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar4 = bVar1;
              }
              bVar1 = "patch"[lVar2];
              bVar5 = bVar1 | 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar5 = bVar1;
              }
              if (bVar4 != bVar5) break;
              lVar2 = lVar2 + 1;
              if (lVar2 == 5) {
                return 2;
              }
            }
          }
          goto LAB_0010182b;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
    }
  }
  return 1;
}

Assistant:

static int classify_keyword(const char* start, const char* end, int flags) {
	if (end - start == 5 && my_memcasecmp(start, "alpha", 5) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start == 4 && my_memcasecmp(start, "beta", 4) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start == 2 && my_memcasecmp(start, "rc", 2) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start >= 3 && my_memcasecmp(start, "pre", 3) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start >= 4 && my_memcasecmp(start, "post", 4) == 0)
		return KEYWORD_POST_RELEASE;
	else if (end - start >= 5 && my_memcasecmp(start, "patch", 5) == 0)
		return KEYWORD_POST_RELEASE;
	else if (end - start == 2 && my_memcasecmp(start, "pl", 2) == 0)  /* patchlevel */
		return KEYWORD_POST_RELEASE;
	else if (end - start == 6 && my_memcasecmp(start, "errata", 6) == 0)
		return KEYWORD_POST_RELEASE;
	else if (flags & VERSIONFLAG_P_IS_PATCH && end - start == 1 && (*start == 'p' || *start == 'P'))
		return KEYWORD_POST_RELEASE;

	return KEYWORD_UNKNOWN;
}